

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

bool __thiscall ghc::filesystem::path::has_stem(path *this)

{
  path local_28;
  
  stem(&local_28,this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._path._M_dataplus._M_p != &local_28._path.field_2) {
    operator_delete(local_28._path._M_dataplus._M_p);
  }
  return local_28._path._M_string_length != 0;
}

Assistant:

GHC_INLINE bool path::has_stem() const
{
    return !stem().empty();
}